

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall minibag::View::iterator::~iterator(iterator *this)

{
  if (this->message_instance_ != (MessageInstance *)0x0) {
    operator_delete(this->message_instance_,0x28);
  }
  std::_Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::
  ~_Vector_base(&(this->iters_).
                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
               );
  return;
}

Assistant:

View::iterator::~iterator()
{
  if (message_instance_ != NULL)
    delete message_instance_;
}